

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManMergeNodeChoice(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  int *piVar1;
  Amap_Cut_t AVar2;
  uint uVar3;
  Amap_Cut_t *pCut;
  Amap_Obj_t *pAVar4;
  
  pAVar4 = pNode;
  while (pAVar4 != (Amap_Obj_t *)0x0) {
    uVar3 = 0;
    for (pCut = (Amap_Cut_t *)(pAVar4->field_11).pData;
        (uVar3 < *(uint *)&pAVar4->field_0x8 >> 0xc && (pCut != (Amap_Cut_t *)0x0));
        pCut = pCut + (ulong)((uint)AVar2 >> 0x11) + 1) {
      AVar2 = *pCut;
      if (AVar2._0_2_ != 0) {
        Amap_ManCutStore(p,pCut,((uint)((ulong)*(undefined8 *)pAVar4 >> 0x20) ^
                                (uint)((ulong)*(undefined8 *)pNode >> 0x20)) >> 0x1d & 1);
        AVar2 = *pCut;
      }
      uVar3 = uVar3 + 1;
    }
    (pAVar4->field_11).pData = (void *)0x0;
    piVar1 = &pAVar4->Equiv;
    pAVar4 = (Amap_Obj_t *)0x0;
    if (*piVar1 != 0) {
      pAVar4 = Amap_ManObj(p,*piVar1);
    }
  }
  Amap_ManCutSaveStored(p,pNode);
  return;
}

Assistant:

void Amap_ManMergeNodeChoice( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pTemp;
    Amap_Cut_t * pCut;
    int c;
    // go through the nodes of the choice node
    for ( pTemp = pNode; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        Amap_NodeForEachCut( pTemp, pCut, c )
        {
            if (!pCut) break;   // mikelee added; abort when pCut is NULL
            if ( pCut->iMat )
                Amap_ManCutStore( p, pCut, pNode->fPhase ^ pTemp->fPhase );
        }
        pTemp->pData = NULL;
    }
    Amap_ManCutSaveStored( p, pNode );

//    Amap_ManPrintCuts( pNode );
}